

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3PagerUnrefNotNull(DbPage *pPg)

{
  int *piVar1;
  i16 *piVar2;
  Pager *pPVar3;
  
  if ((pPg->flags & 0x20) != 0) {
    pPVar3 = pPg->pPager;
    pPVar3->nMmapOut = pPVar3->nMmapOut + -1;
    pPg->pDirty = pPVar3->pMmapFreelist;
    pPVar3->pMmapFreelist = pPg;
    (*pPVar3->fd->pMethods->xUnfetch)
              (pPVar3->fd,(ulong)(pPg->pgno - 1) * pPVar3->pageSize,pPg->pData);
    return;
  }
  piVar1 = &pPg->pCache->nRefSum;
  *piVar1 = *piVar1 + -1;
  piVar2 = &pPg->nRef;
  *piVar2 = *piVar2 + -1;
  if (*piVar2 != 0) {
    return;
  }
  if ((pPg->flags & 1) == 0) {
    pcacheManageDirtyList(pPg,'\x03');
    return;
  }
  if (pPg->pCache->bPurgeable != '\0') {
    (*sqlite3Config.pcache2.xUnpin)(pPg->pCache->pCache,pPg->pPage,0);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PagerUnrefNotNull(DbPage *pPg){
  TESTONLY( Pager *pPager = pPg->pPager; )
  assert( pPg!=0 );
  if( pPg->flags & PGHDR_MMAP ){
    assert( pPg->pgno!=1 );  /* Page1 is never memory mapped */
    pagerReleaseMapPage(pPg);
  }else{
    sqlite3PcacheRelease(pPg);
  }
  /* Do not use this routine to release the last reference to page1 */
  assert( sqlite3PcacheRefCount(pPager->pPCache)>0 );
}